

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.cpp
# Opt level: O1

uint8_t * icu_63::BytesTrie::jumpByDelta(uint8_t *pos)

{
  byte bVar1;
  uint uVar2;
  uint8_t *puVar3;
  
  bVar1 = *pos;
  uVar2 = (uint)bVar1;
  if (bVar1 < 0xc0) {
    puVar3 = pos + 1;
  }
  else if (bVar1 < 0xf0) {
    puVar3 = pos + 2;
    uVar2 = ((uint)bVar1 * 0x100 + (uint)pos[1]) - 0xc000;
  }
  else if (bVar1 < 0xfe) {
    uVar2 = ((uint)pos[2] + ((uint)pos[1] << 8 | (uint)bVar1 << 0x10)) - 0xf00000;
    puVar3 = pos + 3;
  }
  else if (bVar1 == 0xfe) {
    uVar2 = (uint)pos[2] << 8 | (uint)pos[1] << 0x10 | (uint)pos[3];
    puVar3 = pos + 4;
  }
  else {
    uVar2 = (uint)pos[4] | (uint)pos[3] << 8 | (uint)pos[2] << 0x10 | (uint)pos[1] << 0x18;
    puVar3 = pos + 5;
  }
  return puVar3 + (int)uVar2;
}

Assistant:

const uint8_t *
BytesTrie::jumpByDelta(const uint8_t *pos) {
    int32_t delta=*pos++;
    if(delta<kMinTwoByteDeltaLead) {
        // nothing to do
    } else if(delta<kMinThreeByteDeltaLead) {
        delta=((delta-kMinTwoByteDeltaLead)<<8)|*pos++;
    } else if(delta<kFourByteDeltaLead) {
        delta=((delta-kMinThreeByteDeltaLead)<<16)|(pos[0]<<8)|pos[1];
        pos+=2;
    } else if(delta==kFourByteDeltaLead) {
        delta=(pos[0]<<16)|(pos[1]<<8)|pos[2];
        pos+=3;
    } else {
        delta=(pos[0]<<24)|(pos[1]<<16)|(pos[2]<<8)|pos[3];
        pos+=4;
    }
    return pos+delta;
}